

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_lines(lua_State *L)

{
  long lVar1;
  undefined4 *puVar2;
  int iVar3;
  long in_RDI;
  IOFileUD *iof;
  lua_State *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff38;
  lua_State *in_stack_ffffffffffffff40;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    lVar1 = *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x18) = lVar1 + 8;
    *(undefined4 *)(lVar1 + 4) = 0xffffffff;
  }
  if (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -1) {
    puVar2 = *(undefined4 **)(in_RDI + 0x10);
    *puVar2 = *(undefined4 *)((ulong)*(uint *)(in_RDI + 8) + 0x228);
    puVar2[1] = 0xfffffff3;
  }
  else {
    in_stack_ffffffffffffff20 =
         (lua_State *)io_file_open(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    (in_stack_ffffffffffffff20->glref).ptr32 = 4;
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
    puVar2 = *(undefined4 **)(in_RDI + 0x10);
    *puVar2 = **(undefined4 **)(in_RDI + 0x18);
    puVar2[1] = 0xfffffff3;
  }
  iVar3 = io_file_lines(in_stack_ffffffffffffff20);
  return iVar3;
}

Assistant:

LJLIB_CF(io_lines)
{
  if (L->base == L->top) setnilV(L->top++);
  if (!tvisnil(L->base)) {  /* io.lines(fname) */
    IOFileUD *iof = io_file_open(L, "r");
    iof->type = IOFILE_TYPE_FILE|IOFILE_FLAG_CLOSE;
    L->top--;
    setudataV(L, L->base, udataV(L->top));
  } else {  /* io.lines() iterates over stdin. */
    setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_INPUT));
  }
  return io_file_lines(L);
}